

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O3

void Dar_BalanceCone_rec(Aig_Obj_t *pRoot,Aig_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  size_t __size;
  Aig_Obj_t *pObj_00;
  void **ppvVar1;
  int iVar2;
  
  do {
    if (pObj == pRoot) {
      if (((ulong)pObj & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                      ,0x70,"void Dar_BalanceCone_rec(Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
    }
    else {
      if (((ulong)pObj & 1) != 0) {
        iVar2 = vSuper->nSize;
LAB_004f7559:
        if (iVar2 == vSuper->nCap) {
          if (iVar2 < 0x10) {
            if (vSuper->pArray == (void **)0x0) {
              ppvVar1 = (void **)malloc(0x80);
            }
            else {
              ppvVar1 = (void **)realloc(vSuper->pArray,0x80);
            }
            vSuper->pArray = ppvVar1;
            vSuper->nCap = 0x10;
          }
          else {
            __size = (ulong)(uint)(iVar2 * 2) * 8;
            if (vSuper->pArray == (void **)0x0) {
              ppvVar1 = (void **)malloc(__size);
            }
            else {
              ppvVar1 = (void **)realloc(vSuper->pArray,__size);
            }
            vSuper->pArray = ppvVar1;
            vSuper->nCap = iVar2 * 2;
          }
        }
        else {
          ppvVar1 = vSuper->pArray;
        }
        iVar2 = vSuper->nSize;
        vSuper->nSize = iVar2 + 1;
        ppvVar1[iVar2] = pObj;
        return;
      }
      iVar2 = vSuper->nSize;
      if (((*(ulong *)&pObj->field_0x18 & 0xffffff80) != 0 ||
           ((*(uint *)&pRoot->field_0x18 ^ (uint)*(ulong *)&pObj->field_0x18) & 7) != 0) ||
         (10000 < iVar2)) goto LAB_004f7559;
    }
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                    ,0x71,"void Dar_BalanceCone_rec(Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    pObj_00 = Aig_ObjReal_rec(pObj->pFanin0);
    Dar_BalanceCone_rec(pRoot,pObj_00,vSuper);
    pObj = Aig_ObjReal_rec(pObj->pFanin1);
  } while( true );
}

Assistant:

void Dar_BalanceCone_rec( Aig_Obj_t * pRoot, Aig_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( pObj != pRoot && (Aig_IsComplement(pObj) || Aig_ObjType(pObj) != Aig_ObjType(pRoot) || Aig_ObjRefs(pObj) > 1 || Vec_PtrSize(vSuper) > 10000) )
        Vec_PtrPush( vSuper, pObj );
    else
    {
        assert( !Aig_IsComplement(pObj) );
        assert( Aig_ObjIsNode(pObj) );
        // go through the branches
        Dar_BalanceCone_rec( pRoot, Aig_ObjReal_rec( Aig_ObjChild0(pObj) ), vSuper );
        Dar_BalanceCone_rec( pRoot, Aig_ObjReal_rec( Aig_ObjChild1(pObj) ), vSuper );
    }
}